

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlStaticCopyNode(xmlNodePtr node,xmlDocPtr doc,xmlNodePtr parent,int extended)

{
  _xmlNode *p_Var1;
  xmlElementType xVar2;
  xmlDocPtr pxVar3;
  xmlNodePtr pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlRegisterNodeFunc *pp_Var7;
  xmlNodePtr pxVar8;
  xmlNsPtr pxVar9;
  xmlNs *pxVar10;
  xmlAttrPtr pxVar11;
  xmlEntityPtr pxVar12;
  _xmlNode **pp_Var13;
  _xmlNode *node_00;
  _xmlNode *parent_00;
  
  if (node == (xmlNodePtr)0x0) {
LAB_001807b3:
    return (xmlNodePtr)0x0;
  }
  switch(node->type) {
  case XML_ATTRIBUTE_NODE:
    pxVar4 = (xmlNodePtr)xmlCopyPropInternal(doc,parent,(xmlAttrPtr)node);
    return pxVar4;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    pxVar3 = xmlCopyDoc((xmlDocPtr)node,extended);
    return (xmlNodePtr)pxVar3;
  case XML_DOCUMENT_TYPE_NODE:
  case XML_NOTATION_NODE:
  case XML_DTD_NODE:
  case XML_ELEMENT_DECL:
  case XML_ATTRIBUTE_DECL:
  case XML_ENTITY_DECL:
    goto LAB_001807b3;
  case XML_NAMESPACE_DECL:
    pxVar4 = (xmlNodePtr)xmlCopyNamespaceList((xmlNsPtr)node);
    return pxVar4;
  }
  pxVar4 = (xmlNodePtr)(*xmlMalloc)(0x78);
  if (pxVar4 == (xmlNodePtr)0x0) {
    xmlTreeErrMemory("copying node");
    return (xmlNodePtr)0x0;
  }
  pxVar4->nsDef = (xmlNs *)0x0;
  pxVar4->psvi = (void *)0x0;
  pxVar4->content = (xmlChar *)0x0;
  pxVar4->properties = (_xmlAttr *)0x0;
  pxVar4->doc = (_xmlDoc *)0x0;
  pxVar4->ns = (xmlNs *)0x0;
  pxVar4->next = (_xmlNode *)0x0;
  pxVar4->prev = (_xmlNode *)0x0;
  pxVar4->last = (_xmlNode *)0x0;
  pxVar4->parent = (_xmlNode *)0x0;
  pxVar4->name = (xmlChar *)0x0;
  pxVar4->children = (_xmlNode *)0x0;
  pxVar4->line = 0;
  pxVar4->extra = 0;
  *(undefined4 *)&pxVar4->field_0x74 = 0;
  pxVar4->_private = (void *)0x0;
  *(undefined8 *)&pxVar4->type = 0;
  pxVar4->type = node->type;
  pxVar4->doc = doc;
  pxVar4->parent = parent;
  pxVar6 = node->name;
  pxVar5 = "text";
  if (((pxVar6 != "text") && (pxVar5 = "textnoenc", pxVar6 != "textnoenc")) &&
     (pxVar5 = "comment", pxVar6 != "comment")) {
    if (pxVar6 == (xmlChar *)0x0) goto LAB_001808bc;
    if ((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) {
      pxVar5 = xmlStrdup(pxVar6);
    }
    else {
      pxVar5 = xmlDictLookup(doc->dict,pxVar6,-1);
    }
  }
  pxVar4->name = pxVar5;
LAB_001808bc:
  xVar2 = node->type;
  if (xVar2 == XML_ELEMENT_NODE) {
    pxVar4->line = node->line;
  }
  else if ((node->content != (xmlChar *)0x0) &&
          ((XML_XINCLUDE_END < xVar2 ||
           ((0x180020U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)))) {
    pxVar6 = xmlStrdup(node->content);
    pxVar4->content = pxVar6;
  }
  if (parent != (xmlNodePtr)0x0) {
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var7 = __xmlRegisterNodeDefaultValue(), *pp_Var7 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var7 = __xmlRegisterNodeDefaultValue();
      (**pp_Var7)(pxVar4);
    }
    pxVar8 = xmlAddChild(parent,pxVar4);
    if (pxVar8 != pxVar4) {
      return pxVar8;
    }
  }
  if (extended != 0) {
    if (((node->type == XML_XINCLUDE_START) || (node->type == XML_ELEMENT_NODE)) &&
       (node->nsDef != (xmlNsPtr)0x0)) {
      pxVar9 = xmlCopyNamespaceList(node->nsDef);
      pxVar4->nsDef = pxVar9;
    }
    if (node->ns != (xmlNs *)0x0) {
      pxVar10 = xmlSearchNs(doc,pxVar4,node->ns->prefix);
      if (pxVar10 == (xmlNsPtr)0x0) {
        pxVar9 = xmlSearchNs(node->doc,node,node->ns->prefix);
        p_Var1 = pxVar4;
        if (pxVar9 == (xmlNsPtr)0x0) {
          pxVar10 = xmlNewReconciledNs(doc,pxVar4,node->ns);
        }
        else {
          do {
            pxVar8 = p_Var1;
            p_Var1 = pxVar8->parent;
          } while (p_Var1 != (_xmlNode *)0x0);
          pxVar10 = xmlNewNs(pxVar8,pxVar9->href,pxVar9->prefix);
        }
      }
      pxVar4->ns = pxVar10;
    }
    xVar2 = node->type;
    if (((xVar2 == XML_XINCLUDE_START) || (xVar2 == XML_ELEMENT_NODE)) &&
       (node->properties != (xmlAttrPtr)0x0)) {
      pxVar11 = xmlCopyPropList(pxVar4,node->properties);
      pxVar4->properties = pxVar11;
      xVar2 = node->type;
    }
    if (xVar2 == XML_ENTITY_REF_NODE) {
      if ((doc == (xmlDocPtr)0x0) || (node->doc != doc)) {
        pxVar12 = xmlGetDocEntity(doc,pxVar4->name);
      }
      else {
        pxVar12 = (xmlEntityPtr)node->children;
      }
      pxVar4->children = (_xmlNode *)pxVar12;
      pxVar4->last = (_xmlNode *)pxVar12;
    }
    else {
      pxVar8 = pxVar4;
      p_Var1 = node->children;
      if (extended != 2 && node->children != (xmlNodePtr)0x0) {
LAB_00180a21:
        node_00 = p_Var1;
        parent_00 = pxVar8;
        if (node_00 != (xmlNodePtr)0x0) {
          pxVar8 = xmlStaticCopyNode(node_00,doc,parent_00,2);
          if (pxVar8 == (xmlNodePtr)0x0) {
            xmlFreeNode(pxVar4);
            return (xmlNodePtr)0x0;
          }
          p_Var1 = parent_00->last;
          if (p_Var1 != pxVar8) {
            if (p_Var1 == (_xmlNode *)0x0) {
              pp_Var13 = &parent_00->children;
            }
            else {
              pxVar8->prev = p_Var1;
              pp_Var13 = &p_Var1->next;
            }
            *pp_Var13 = pxVar8;
            parent_00->last = pxVar8;
          }
          if ((node_00->type == XML_ENTITY_REF_NODE) ||
             (p_Var1 = node_00->children, node_00->children == (_xmlNode *)0x0)) {
            do {
              pxVar8 = parent_00;
              p_Var1 = node_00->next;
              if (node_00->next != (_xmlNode *)0x0) goto LAB_00180a21;
              node_00 = node_00->parent;
              parent_00 = parent_00->parent;
            } while (node_00 != node);
            pxVar8 = parent_00;
            p_Var1 = (xmlNodePtr)0x0;
          }
          goto LAB_00180a21;
        }
      }
    }
  }
  if (parent != (xmlNodePtr)0x0) {
    return pxVar4;
  }
  if (__xmlRegisterCallbacks != 0) {
    pp_Var7 = __xmlRegisterNodeDefaultValue();
    if (*pp_Var7 != (xmlRegisterNodeFunc)0x0) {
      pp_Var7 = __xmlRegisterNodeDefaultValue();
      (**pp_Var7)(pxVar4);
      return pxVar4;
    }
    return pxVar4;
  }
  return pxVar4;
}

Assistant:

xmlNodePtr
xmlStaticCopyNode(xmlNodePtr node, xmlDocPtr doc, xmlNodePtr parent,
                  int extended) {
    xmlNodePtr ret;

    if (node == NULL) return(NULL);
    switch (node->type) {
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ELEMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    break;
        case XML_ATTRIBUTE_NODE:
		return((xmlNodePtr) xmlCopyPropInternal(doc, parent, (xmlAttrPtr) node));
        case XML_NAMESPACE_DECL:
	    return((xmlNodePtr) xmlCopyNamespaceList((xmlNsPtr) node));

        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_TREE_ENABLED
	    return((xmlNodePtr) xmlCopyDoc((xmlDocPtr) node, extended));
#endif /* LIBXML_TREE_ENABLED */
        case XML_DOCUMENT_TYPE_NODE:
        case XML_NOTATION_NODE:
        case XML_DTD_NODE:
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
            return(NULL);
    }

    /*
     * Allocate a new node and fill the fields.
     */
    ret = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (ret == NULL) {
	xmlTreeErrMemory("copying node");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlNode));
    ret->type = node->type;

    ret->doc = doc;
    ret->parent = parent;
    if (node->name == xmlStringText)
	ret->name = xmlStringText;
    else if (node->name == xmlStringTextNoenc)
	ret->name = xmlStringTextNoenc;
    else if (node->name == xmlStringComment)
	ret->name = xmlStringComment;
    else if (node->name != NULL) {
        if ((doc != NULL) && (doc->dict != NULL))
	    ret->name = xmlDictLookup(doc->dict, node->name, -1);
	else
	    ret->name = xmlStrdup(node->name);
    }
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->content != NULL) &&
	(node->type != XML_ENTITY_REF_NODE) &&
	(node->type != XML_XINCLUDE_END) &&
	(node->type != XML_XINCLUDE_START)) {
	ret->content = xmlStrdup(node->content);
    }else{
      if (node->type == XML_ELEMENT_NODE)
        ret->line = node->line;
    }
    if (parent != NULL) {
	xmlNodePtr tmp;

	/*
	 * this is a tricky part for the node register thing:
	 * in case ret does get coalesced in xmlAddChild
	 * the deregister-node callback is called; so we register ret now already
	 */
	if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	    xmlRegisterNodeDefaultValue((xmlNodePtr)ret);

        /*
         * Note that since ret->parent is already set, xmlAddChild will
         * return early and not actually insert the node. It will only
         * coalesce text nodes and unnecessarily call xmlSetTreeDoc.
         * Assuming that the subtree to be copied always has its text
         * nodes coalesced, the somewhat confusing call to xmlAddChild
         * could be removed.
         */
        tmp = xmlAddChild(parent, ret);
	/* node could have coalesced */
	if (tmp != ret)
	    return(tmp);
    }

    if (!extended)
	goto out;
    if (((node->type == XML_ELEMENT_NODE) ||
         (node->type == XML_XINCLUDE_START)) && (node->nsDef != NULL))
        ret->nsDef = xmlCopyNamespaceList(node->nsDef);

    if (node->ns != NULL) {
        xmlNsPtr ns;

	ns = xmlSearchNs(doc, ret, node->ns->prefix);
	if (ns == NULL) {
	    /*
	     * Humm, we are copying an element whose namespace is defined
	     * out of the new tree scope. Search it in the original tree
	     * and add it at the top of the new tree
	     */
	    ns = xmlSearchNs(node->doc, node, node->ns->prefix);
	    if (ns != NULL) {
	        xmlNodePtr root = ret;

		while (root->parent != NULL) root = root->parent;
		ret->ns = xmlNewNs(root, ns->href, ns->prefix);
		} else {
			ret->ns = xmlNewReconciledNs(doc, ret, node->ns);
	    }
	} else {
	    /*
	     * reference the existing namespace definition in our own tree.
	     */
	    ret->ns = ns;
	}
    }
    if (((node->type == XML_ELEMENT_NODE) ||
         (node->type == XML_XINCLUDE_START)) && (node->properties != NULL))
        ret->properties = xmlCopyPropList(ret, node->properties);
    if (node->type == XML_ENTITY_REF_NODE) {
	if ((doc == NULL) || (node->doc != doc)) {
	    /*
	     * The copied node will go into a separate document, so
	     * to avoid dangling references to the ENTITY_DECL node
	     * we cannot keep the reference. Try to find it in the
	     * target document.
	     */
	    ret->children = (xmlNodePtr) xmlGetDocEntity(doc, ret->name);
	} else {
            ret->children = node->children;
	}
	ret->last = ret->children;
    } else if ((node->children != NULL) && (extended != 2)) {
        xmlNodePtr cur, insert;

        cur = node->children;
        insert = ret;
        while (cur != NULL) {
            xmlNodePtr copy = xmlStaticCopyNode(cur, doc, insert, 2);
            if (copy == NULL) {
                xmlFreeNode(ret);
                return(NULL);
            }

            /* Check for coalesced text nodes */
            if (insert->last != copy) {
                if (insert->last == NULL) {
                    insert->children = copy;
                } else {
                    copy->prev = insert->last;
                    insert->last->next = copy;
                }
                insert->last = copy;
            }

            if ((cur->type != XML_ENTITY_REF_NODE) &&
                (cur->children != NULL)) {
                cur = cur->children;
                insert = copy;
                continue;
            }

            while (1) {
                if (cur->next != NULL) {
                    cur = cur->next;
                    break;
                }

                cur = cur->parent;
                insert = insert->parent;
                if (cur == node) {
                    cur = NULL;
                    break;
                }
            }
        }
    }

out:
    /* if parent != NULL we already registered the node above */
    if ((parent == NULL) &&
        ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue)))
	xmlRegisterNodeDefaultValue((xmlNodePtr)ret);
    return(ret);
}